

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

ptrdiff_t Imf_3_4::anon_unknown_1::cachePadding(ptrdiff_t size)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  
  bVar2 = 9;
  do {
    bVar3 = bVar2;
    bVar2 = bVar3 + 1;
  } while (1 < size >> (bVar2 & 0x3f));
  lVar1 = 1L << (bVar3 + 2 & 0x3f);
  if (lVar1 + -0x40 < size) {
    return (lVar1 - size) + 0x40;
  }
  lVar1 = 1L << (bVar2 & 0x3f);
  if (size < lVar1 + 0x40) {
    return (lVar1 - size) + 0x40;
  }
  return 0;
}

Assistant:

ptrdiff_t
cachePadding (ptrdiff_t size)
{
    //
    // Some of the buffers that are allocated by classes ToYca and
    // FromYca, below, may need to be padded to avoid cache thrashing.
    // If the difference between the buffer size and the nearest power
    // of two is less than CACHE_LINE_SIZE, then we add an appropriate
    // amount of padding.
    //
    // CACHE_LINE_SIZE must be a power of two, and it must be at
    // least as big as the true size of a cache line on the machine
    // we are running on.  (It is ok if CACHE_LINE_SIZE is larger
    // than a real cache line.)
    //
    // CACHE_LINE_SIZE = (1 << LOG2_CACHE_LINE_SIZE)
    //

    static int LOG2_CACHE_LINE_SIZE = 8;

    size_t i = LOG2_CACHE_LINE_SIZE + 2;

    while ((size >> i) > 1)
        ++i;

    if (size > (1ll << (i + 1)) - 64ll)
        return 64ll + ((1ll << (i + 1ll)) - size);

    if (size < (1ll << i) + 64ll) return 64ll + ((1ll << i) - size);

    return 0;
}